

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O1

void __thiscall
CoreML::Specification::LSTMWeightParams::CheckTypeAndMergeFrom
          (LSTMWeightParams *this,MessageLite *from)

{
  ulong uVar1;
  LogMessage *other;
  WeightParams *pWVar2;
  undefined1 *puVar3;
  Arena *pAVar4;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__LSTMWeightParams_004b6a58) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::LSTMWeightParams *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((LSTMWeightParams *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x8df1);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[1]._vptr_MessageLite != (_func_int **)0x0)) {
    if (this->inputgateweightmatrix_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->inputgateweightmatrix_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[1]._vptr_MessageLite;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->inputgateweightmatrix_,(WeightParams *)puVar3);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[1]._internal_metadata_.ptr_ != 0)) {
    if (this->forgetgateweightmatrix_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->forgetgateweightmatrix_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[1]._internal_metadata_.ptr_;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->forgetgateweightmatrix_,(WeightParams *)puVar3);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[2]._vptr_MessageLite != (_func_int **)0x0)) {
    if (this->blockinputweightmatrix_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->blockinputweightmatrix_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[2]._vptr_MessageLite;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->blockinputweightmatrix_,(WeightParams *)puVar3);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[2]._internal_metadata_.ptr_ != 0)) {
    if (this->outputgateweightmatrix_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->outputgateweightmatrix_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[2]._internal_metadata_.ptr_;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->outputgateweightmatrix_,(WeightParams *)puVar3);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[3]._vptr_MessageLite != (_func_int **)0x0)) {
    if (this->inputgaterecursionmatrix_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->inputgaterecursionmatrix_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[3]._vptr_MessageLite;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->inputgaterecursionmatrix_,(WeightParams *)puVar3);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[3]._internal_metadata_.ptr_ != 0)) {
    if (this->forgetgaterecursionmatrix_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->forgetgaterecursionmatrix_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[3]._internal_metadata_.ptr_;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->forgetgaterecursionmatrix_,(WeightParams *)puVar3);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[4]._vptr_MessageLite != (_func_int **)0x0)) {
    if (this->blockinputrecursionmatrix_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->blockinputrecursionmatrix_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[4]._vptr_MessageLite;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->blockinputrecursionmatrix_,(WeightParams *)puVar3);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[4]._internal_metadata_.ptr_ != 0)) {
    if (this->outputgaterecursionmatrix_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->outputgaterecursionmatrix_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[4]._internal_metadata_.ptr_;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->outputgaterecursionmatrix_,(WeightParams *)puVar3);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[5]._vptr_MessageLite != (_func_int **)0x0)) {
    if (this->inputgatebiasvector_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->inputgatebiasvector_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[5]._vptr_MessageLite;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->inputgatebiasvector_,(WeightParams *)puVar3);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[5]._internal_metadata_.ptr_ != 0)) {
    if (this->forgetgatebiasvector_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->forgetgatebiasvector_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[5]._internal_metadata_.ptr_;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->forgetgatebiasvector_,(WeightParams *)puVar3);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[6]._vptr_MessageLite != (_func_int **)0x0)) {
    if (this->blockinputbiasvector_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->blockinputbiasvector_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[6]._vptr_MessageLite;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->blockinputbiasvector_,(WeightParams *)puVar3);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[6]._internal_metadata_.ptr_ != 0)) {
    if (this->outputgatebiasvector_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->outputgatebiasvector_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[6]._internal_metadata_.ptr_;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->outputgatebiasvector_,(WeightParams *)puVar3);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[7]._vptr_MessageLite != (_func_int **)0x0)) {
    if (this->inputgatepeepholevector_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->inputgatepeepholevector_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[7]._vptr_MessageLite;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->inputgatepeepholevector_,(WeightParams *)puVar3);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[7]._internal_metadata_.ptr_ != 0)) {
    if (this->forgetgatepeepholevector_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->forgetgatepeepholevector_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[7]._internal_metadata_.ptr_;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->forgetgatepeepholevector_,(WeightParams *)puVar3);
  }
  if ((from != (MessageLite *)_LSTMWeightParams_default_instance_) &&
     (from[8]._vptr_MessageLite != (_func_int **)0x0)) {
    if (this->outputgatepeepholevector_ == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->outputgatepeepholevector_ = pWVar2;
    }
    puVar3 = (undefined1 *)from[8]._vptr_MessageLite;
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->outputgatepeepholevector_,(WeightParams *)puVar3);
  }
  uVar1 = (from->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}